

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_tpl_varnames_h.cc
# Opt level: O0

bool WriteToDisk(bool log_info,string *output_file,string *text)

{
  char *pcVar1;
  FILE *__s;
  undefined8 uVar2;
  void *__ptr;
  size_t sVar3;
  size_t sVar4;
  int *piVar5;
  FILE *outfile;
  string *text_local;
  string *output_file_local;
  bool log_info_local;
  
  pcVar1 = (char *)std::__cxx11::string::c_str();
  __s = fopen(pcVar1,"wb");
  if (__s == (FILE *)0x0) {
    uVar2 = std::__cxx11::string::c_str();
    LogPrintf(2,(uint)log_info,"Can\'t open %s",uVar2);
    output_file_local._7_1_ = false;
  }
  else {
    uVar2 = std::__cxx11::string::c_str();
    LogPrintf(0,(uint)log_info,"Creating %s",uVar2);
    __ptr = (void *)std::__cxx11::string::c_str();
    sVar3 = std::__cxx11::string::length();
    sVar3 = fwrite(__ptr,1,sVar3,__s);
    sVar4 = std::__cxx11::string::length();
    if (sVar3 != sVar4) {
      uVar2 = std::__cxx11::string::c_str();
      piVar5 = __errno_location();
      pcVar1 = strerror(*piVar5);
      LogPrintf(2,(uint)log_info,"Can\'t write %s: %s",uVar2,pcVar1);
    }
    fclose(__s);
    output_file_local._7_1_ = true;
  }
  return output_file_local._7_1_;
}

Assistant:

static bool WriteToDisk(bool log_info, const string& output_file,
                        const string& text) {
  FILE* outfile = fopen(output_file.c_str(), "wb");
  if (!outfile) {
    LogPrintf(LOG_ERROR, log_info, "Can't open %s", output_file.c_str());
    return false;
  }
  LogPrintf(LOG_INFO, log_info, "Creating %s", output_file.c_str());
  if (fwrite(text.c_str(), 1, text.length(), outfile) != text.length()) {
    LogPrintf(LOG_ERROR, log_info, "Can't write %s: %s",
              output_file.c_str(), strerror(errno));
  }
  fclose(outfile);
  return true;
}